

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_ischar(char c,char *set)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  char **ppcVar4;
  uchar (*__s) [256];
  long lVar5;
  long lVar6;
  byte bVar7;
  size_t __size;
  byte *pbVar8;
  
  uVar2 = stb_perfect_hash(&stb_ischar::p,(uint)set);
  ppcVar4 = stb_ischar::sets;
  __s = stb_ischar::tables;
  if ((int)uVar2 < 0) {
    if (set != (char *)0x0) {
      if ((stb_ischar::sets == (char **)0x0) ||
         (*(int *)((long)stb_ischar::sets + -0xc) <= *(int *)(stb_ischar::sets + -2))) {
        stb__arr_addlen_(&stb_ischar::sets,8,1);
        ppcVar4 = stb_ischar::sets;
      }
      else {
        *(int *)(stb_ischar::sets + -2) = *(int *)(stb_ischar::sets + -2) + 1;
      }
      ppcVar4[(long)*(int *)(ppcVar4 + -2) + -1] = set;
      stb_perfect_destroy(&stb_ischar::p);
      if (stb_ischar::sets == (char **)0x0) {
        iVar3 = 0;
      }
      else {
        iVar3 = *(int *)(stb_ischar::sets + -2);
      }
      iVar3 = stb_perfect_create(&stb_ischar::p,(uint *)stb_ischar::sets,iVar3);
      if (iVar3 == 0) {
        __assert_fail("n != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0xea6,"int stb_ischar(char, char *)");
      }
      __size = (long)(iVar3 + 7 >> 3) << 8;
      __s = (uchar (*) [256])realloc(stb_ischar::tables,__size);
      lVar6 = 0;
      stb_ischar::tables = __s;
      memset(__s,0,__size);
      ppcVar4 = stb_ischar::sets;
LAB_0014e2b8:
      if (ppcVar4 == (char **)0x0) {
        lVar5 = 0;
      }
      else {
        lVar5 = (long)*(int *)(ppcVar4 + -2);
      }
      if (lVar6 < lVar5) {
        pbVar8 = (byte *)ppcVar4[lVar6];
        uVar2 = stb_perfect_hash(&stb_ischar::p,(uint)pbVar8);
        if ((int)uVar2 < 0) {
          __assert_fail("k >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0xeac,"int stb_ischar(char, char *)");
        }
        bVar1 = stb_ischar::bit[uVar2 & 7];
        lVar5 = 0;
        do {
          if (lVar5 == 0) {
            bVar7 = *pbVar8;
          }
          else {
            bVar7 = pbVar8[lVar5];
            if (bVar7 == 0) goto code_r0x0014e319;
          }
          __s[uVar2 >> 3][bVar7] = __s[uVar2 >> 3][bVar7] | bVar1;
          lVar5 = lVar5 + 1;
          pbVar8 = (byte *)ppcVar4[lVar6];
        } while( true );
      }
      uVar2 = stb_perfect_hash(&stb_ischar::p,(uint)set);
      goto LAB_0014e333;
    }
    stb_arr_free_(&stb_ischar::sets);
    free(stb_ischar::tables);
    stb_ischar::tables = (uchar (*) [256])0x0;
    stb_perfect_destroy(&stb_ischar::p);
    uVar2 = 0;
  }
  else {
LAB_0014e333:
    uVar2 = (uint)(stb_ischar::bit[uVar2 & 7] & __s[(int)uVar2 >> 3][(byte)c]);
  }
  return uVar2;
code_r0x0014e319:
  lVar6 = lVar6 + 1;
  goto LAB_0014e2b8;
}

Assistant:

int stb_ischar(char c, char *set)
{
   static unsigned char bit[8] = { 1,2,4,8,16,32,64,128 };
   static stb_perfect p;
   static unsigned char (*tables)[256];
   static char ** sets = NULL;

   int z = stb_perfect_hash(&p, (int) set);
   if (z < 0) {
      int i,k,n,j,f;
      // special code that means free all existing data
      if (set == NULL) {
         stb_arr_free(sets);
         free(tables);
         tables = NULL;
         stb_perfect_destroy(&p);
         return 0;
      }
      stb_arr_push(sets, set);
      stb_perfect_destroy(&p);
      n = stb_perfect_create(&p, (unsigned int *) (char **) sets, stb_arr_len(sets));
      assert(n != 0);
      k = (n+7) >> 3;
      tables = (unsigned char (*)[256]) realloc(tables, sizeof(*tables) * k);
      memset(tables, 0, sizeof(*tables) * k);
      for (i=0; i < stb_arr_len(sets); ++i) {
         k = stb_perfect_hash(&p, (int) sets[i]);
         assert(k >= 0);
         n = k >> 3;
         f = bit[k&7];
         for (j=0; !j || sets[i][j]; ++j) {
            tables[n][(unsigned char) sets[i][j]] |= f;
         }
      }
      z = stb_perfect_hash(&p, (int) set);
   }
   return tables[z >> 3][(unsigned char) c] & bit[z & 7];
}